

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O0

bool __thiscall osQueue::Contains(osQueue *this,void *object)

{
  int local_24;
  int local_20;
  int i;
  int index;
  bool rc;
  void *object_local;
  osQueue *this_local;
  
  i._3_1_ = false;
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x95);
  local_20 = this->NextOutIndex;
  local_24 = 0;
  do {
    if (this->ElementCount <= local_24) {
LAB_0010e1c3:
      osMutex::Give(&this->Lock);
      return i._3_1_;
    }
    if (object == this->Array[local_20]) {
      i._3_1_ = true;
      goto LAB_0010e1c3;
    }
    local_20 = Increment(this,local_20);
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool osQueue::Contains(void* object)
{
    bool rc = false;
    int index;
    int i;

    Lock.Take(__FILE__, __LINE__);

    index = NextOutIndex;

    for (i = 0; i < ElementCount; i++)
    {
        if (object == Array[index])
        {
            rc = true;
            break;
        }
        index = Increment(index);
    }

    Lock.Give();

    return rc;
}